

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssh-certs.c
# Opt level: O0

ssh_keyalg * opensshcert_related_alg(ssh_keyalg *self,ssh_keyalg *base)

{
  ssh_keyalg *alg_i;
  size_t i;
  ssh_keyalg *base_local;
  ssh_keyalg *self_local;
  
  alg_i = (ssh_keyalg *)0x0;
  while ((self_local = self, alg_i < (ssh_keyalg *)0x8 &&
         (self_local = opensshcert_all_keyalgs[(long)alg_i], base != self_local->base_alg))) {
    alg_i = (ssh_keyalg *)((long)&alg_i->new_pub + 1);
  }
  return self_local;
}

Assistant:

static const ssh_keyalg *opensshcert_related_alg(const ssh_keyalg *self,
                                                 const ssh_keyalg *base)
{
    for (size_t i = 0; i < lenof(opensshcert_all_keyalgs); i++) {
        const ssh_keyalg *alg_i = opensshcert_all_keyalgs[i];
        if (base == alg_i->base_alg)
            return alg_i;
    }

    return self;
}